

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O3

void * chck_lut_str_get(chck_lut *lut,char *str,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t uVar5;
  size_t __size;
  uint8_t *puVar6;
  
  if ((lut == (chck_lut *)0x0) || (lut->hashstr == (_func_uint32_t_char_ptr_size_t *)0x0)) {
    __assert_fail("lut && lut->hashstr",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x82,"void *chck_lut_str_get(struct chck_lut *, const char *, size_t)");
  }
  uVar5 = (*lut->hashstr)(str,len);
  puVar6 = lut->table;
  uVar1 = lut->count;
  uVar2 = lut->member;
  if (puVar6 == (uint8_t *)0x0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    __size = SUB168(auVar3 * auVar4,0);
    if ((bool)(~(SUB168(auVar3 * auVar4,8) != 0) & __size != 0)) {
      puVar6 = (uint8_t *)malloc(__size);
      lut->table = puVar6;
      if (puVar6 != (uint8_t *)0x0) {
        memset(puVar6,lut->set,__size);
        goto LAB_0010162a;
      }
    }
    else {
      lut->table = (uint8_t *)0x0;
    }
    puVar6 = (uint8_t *)0x0;
  }
  else {
LAB_0010162a:
    puVar6 = puVar6 + uVar2 * ((ulong)uVar5 % uVar1);
  }
  return puVar6;
}

Assistant:

void*
chck_lut_str_get(struct chck_lut *lut, const char *str, size_t len)
{
   assert(lut && lut->hashstr);
   return lut_get_index(lut, lut->hashstr(str, len) % lut->count);
}